

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlrelationaltablemodel.cpp
# Opt level: O0

QString * __thiscall
QSqlRelationalTableModelPrivate::fullyQualifiedFieldName
          (QSqlRelationalTableModelPrivate *this,QString *tableName,QString *fieldName)

{
  QChar *pQVar1;
  QString *pQVar2;
  QString *in_RCX;
  QString *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *ret;
  QString *in_stack_ffffffffffffffc0;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  QString::QString((QString *)0x159f20);
  QString::size(in_RDX);
  QString::size(in_RCX);
  QString::reserve(in_stack_ffffffffffffffc0,(qsizetype)in_RDX);
  pQVar1 = (QChar *)QString::append((QString *)in_RDI);
  QChar::QChar<char16_t,_true>(&local_a,L'.');
  pQVar2 = (QString *)QString::append(pQVar1);
  QString::append(pQVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QSqlRelationalTableModelPrivate::fullyQualifiedFieldName(const QString &tableName,
                                                                 const QString &fieldName) const
{
    QString ret;
    ret.reserve(tableName.size() + fieldName.size() + 1);
    ret.append(tableName).append(u'.').append(fieldName);

    return ret;
}